

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ali_yundun_delete_cname_waf.cc
# Opt level: O2

int __thiscall
aliyun::Yundun::DeleteCNameWaf
          (Yundun *this,YundunDeleteCNameWafRequestType *req,
          YundunDeleteCNameWafResponseType *response,YundunErrorInfo *error_info)

{
  bool bVar1;
  int iVar2;
  ArrayIndex AVar3;
  AliRpcRequest *this_00;
  Value *pVVar4;
  Value *pVVar5;
  Value *pVVar6;
  char *pcVar7;
  uint index;
  allocator<char> local_434;
  allocator<char> local_433;
  allocator<char> local_432;
  allocator<char> local_431;
  Value val;
  undefined1 local_418 [8];
  _Alloc_hider local_410;
  undefined1 local_408 [24];
  _Alloc_hider local_3f0;
  size_type local_3e8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_3e0;
  Int local_3d0;
  vector<aliyun::YundunDeleteCNameWafWafInfoType,_std::allocator<aliyun::YundunDeleteCNameWafWafInfoType>_>
  *local_3c8;
  string str_response;
  string local_3a0;
  string local_380;
  string local_360;
  string local_340;
  string local_320;
  string local_300;
  string local_2e0;
  string local_2c0;
  string local_2a0;
  string local_280;
  string local_260;
  string local_240;
  string local_220;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_200;
  string local_1e0;
  string local_1c0;
  string local_1a0;
  string secheme;
  string local_160;
  Reader reader;
  
  str_response._M_dataplus._M_p = (pointer)&str_response.field_2;
  str_response._M_string_length = 0;
  str_response.field_2._M_local_buf[0] = '\0';
  pcVar7 = "http";
  if (this->use_tls_ != false) {
    pcVar7 = "https";
  }
  local_3c8 = &response->waf_info_list;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&secheme,pcVar7,(allocator<char> *)&reader);
  this_00 = (AliRpcRequest *)operator_new(0x2c8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1a0,this->version_,(allocator<char> *)local_418);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1c0,this->appid_,(allocator<char> *)&local_160);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1e0,this->secret_,(allocator<char> *)&val);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&reader,
                 &secheme,"://");
  std::operator+(&local_200,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&reader,
                 this->host_);
  AliRpcRequest::AliRpcRequest(this_00,&local_1a0,&local_1c0,&local_1e0,&local_200);
  std::__cxx11::string::~string((string *)&local_200);
  std::__cxx11::string::~string((string *)&reader);
  std::__cxx11::string::~string((string *)&local_1e0);
  std::__cxx11::string::~string((string *)&local_1c0);
  std::__cxx11::string::~string((string *)&local_1a0);
  if (((this->use_tls_ == false) && (pcVar7 = this->proxy_host_, pcVar7 != (char *)0x0)) &&
     (*pcVar7 != '\0')) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_220,pcVar7,(allocator<char> *)&reader);
    AliHttpRequest::SetHttpProxy((AliHttpRequest *)this_00,&local_220);
    std::__cxx11::string::~string((string *)&local_220);
  }
  Json::Value::Value(&val,nullValue);
  Json::Reader::Reader(&reader);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_240,"Action",(allocator<char> *)local_418);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_260,"DeleteCNameWaf",(allocator<char> *)&local_160);
  AliHttpRequest::AddRequestQuery((AliHttpRequest *)this_00,&local_240,&local_260);
  std::__cxx11::string::~string((string *)&local_260);
  std::__cxx11::string::~string((string *)&local_240);
  if ((req->instance_id)._M_string_length != 0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_280,"InstanceId",(allocator<char> *)local_418);
    std::__cxx11::string::string((string *)&local_2a0,(string *)req);
    AliHttpRequest::AddRequestQuery((AliHttpRequest *)this_00,&local_280,&local_2a0);
    std::__cxx11::string::~string((string *)&local_2a0);
    std::__cxx11::string::~string((string *)&local_280);
  }
  if ((req->domain)._M_string_length != 0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_2c0,"Domain",(allocator<char> *)local_418);
    std::__cxx11::string::string((string *)&local_2e0,(string *)&req->domain);
    AliHttpRequest::AddRequestQuery((AliHttpRequest *)this_00,&local_2c0,&local_2e0);
    std::__cxx11::string::~string((string *)&local_2e0);
    std::__cxx11::string::~string((string *)&local_2c0);
  }
  if ((req->cname_id)._M_string_length != 0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_300,"CnameId",(allocator<char> *)local_418);
    std::__cxx11::string::string((string *)&local_320,(string *)&req->cname_id);
    AliHttpRequest::AddRequestQuery((AliHttpRequest *)this_00,&local_300,&local_320);
    std::__cxx11::string::~string((string *)&local_320);
    std::__cxx11::string::~string((string *)&local_300);
  }
  if ((req->instance_type)._M_string_length != 0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_340,"InstanceType",(allocator<char> *)local_418);
    std::__cxx11::string::string((string *)&local_360,(string *)&req->instance_type);
    AliHttpRequest::AddRequestQuery((AliHttpRequest *)this_00,&local_340,&local_360);
    std::__cxx11::string::~string((string *)&local_360);
    std::__cxx11::string::~string((string *)&local_340);
  }
  if ((this->region_id_ != (char *)0x0) && (*this->region_id_ != '\0')) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_380,"RegionId",(allocator<char> *)local_418);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_3a0,this->region_id_,(allocator<char> *)&local_160);
    AliHttpRequest::AddRequestQuery((AliHttpRequest *)this_00,&local_380,&local_3a0);
    std::__cxx11::string::~string((string *)&local_3a0);
    std::__cxx11::string::~string((string *)&local_380);
  }
  iVar2 = (**(this_00->super_AliHttpRequest)._vptr_AliHttpRequest)(this_00);
  if (iVar2 == 0) {
    iVar2 = AliHttpRequest::WaitResponseHeaderComplete((AliHttpRequest *)this_00);
    AliHttpRequest::ReadResponseBody((AliHttpRequest *)this_00,&str_response);
    if (((0 < iVar2) && (str_response._M_string_length != 0)) &&
       (bVar1 = Json::Reader::parse(&reader,&str_response,&val,true), bVar1)) {
      if (error_info != (YundunErrorInfo *)0x0 && iVar2 != 200) {
        bVar1 = Json::Value::isMember(&val,"RequestId");
        if (bVar1) {
          pVVar4 = Json::Value::operator[](&val,"RequestId");
          Json::Value::asString_abi_cxx11_((string *)local_418,pVVar4);
        }
        else {
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)local_418,anon_var_dwarf_12f544 + 9,&local_431);
        }
        std::__cxx11::string::operator=((string *)error_info,(string *)local_418);
        std::__cxx11::string::~string((string *)local_418);
        bVar1 = Json::Value::isMember(&val,"Code");
        if (bVar1) {
          pVVar4 = Json::Value::operator[](&val,"Code");
          Json::Value::asString_abi_cxx11_((string *)local_418,pVVar4);
        }
        else {
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)local_418,anon_var_dwarf_12f544 + 9,&local_432);
        }
        std::__cxx11::string::operator=((string *)&error_info->code,(string *)local_418);
        std::__cxx11::string::~string((string *)local_418);
        bVar1 = Json::Value::isMember(&val,"HostId");
        if (bVar1) {
          pVVar4 = Json::Value::operator[](&val,"HostId");
          Json::Value::asString_abi_cxx11_((string *)local_418,pVVar4);
        }
        else {
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)local_418,anon_var_dwarf_12f544 + 9,&local_433);
        }
        std::__cxx11::string::operator=((string *)&error_info->host_id,(string *)local_418);
        std::__cxx11::string::~string((string *)local_418);
        bVar1 = Json::Value::isMember(&val,"Message");
        if (bVar1) {
          pVVar4 = Json::Value::operator[](&val,"Message");
          Json::Value::asString_abi_cxx11_((string *)local_418,pVVar4);
        }
        else {
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)local_418,anon_var_dwarf_12f544 + 9,&local_434);
        }
        std::__cxx11::string::operator=((string *)&error_info->message,(string *)local_418);
        std::__cxx11::string::~string((string *)local_418);
      }
      if (local_3c8 !=
          (vector<aliyun::YundunDeleteCNameWafWafInfoType,_std::allocator<aliyun::YundunDeleteCNameWafWafInfoType>_>
           *)0x0 && iVar2 == 200) {
        bVar1 = Json::Value::isMember(&val,"WafInfoList");
        iVar2 = 200;
        if (bVar1) {
          pVVar4 = Json::Value::operator[](&val,"WafInfoList");
          bVar1 = Json::Value::isMember(pVVar4,"WafInfo");
          if (bVar1) {
            pVVar4 = Json::Value::operator[](&val,"WafInfoList");
            pVVar4 = Json::Value::operator[](pVVar4,"WafInfo");
            bVar1 = Json::Value::isArray(pVVar4);
            if (bVar1) {
              for (index = 0; AVar3 = Json::Value::size(pVVar4), index < AVar3; index = index + 1) {
                local_410._M_p = local_408 + 8;
                local_408._0_8_ = 0;
                local_408[8] = '\0';
                local_3f0._M_p = (pointer)&local_3e0;
                local_3e8 = 0;
                local_3e0._M_local_buf[0] = '\0';
                pVVar5 = Json::Value::operator[](pVVar4,index);
                bVar1 = Json::Value::isMember(pVVar5,"Id");
                if (bVar1) {
                  pVVar6 = Json::Value::operator[](pVVar5,"Id");
                  local_418._0_4_ = Json::Value::asInt(pVVar6);
                }
                bVar1 = Json::Value::isMember(pVVar5,"Domain");
                if (bVar1) {
                  pVVar6 = Json::Value::operator[](pVVar5,"Domain");
                  Json::Value::asString_abi_cxx11_(&local_160,pVVar6);
                  std::__cxx11::string::operator=((string *)&local_410,(string *)&local_160);
                  std::__cxx11::string::~string((string *)&local_160);
                }
                bVar1 = Json::Value::isMember(pVVar5,"Cname");
                if (bVar1) {
                  pVVar6 = Json::Value::operator[](pVVar5,"Cname");
                  Json::Value::asString_abi_cxx11_(&local_160,pVVar6);
                  std::__cxx11::string::operator=((string *)&local_3f0,(string *)&local_160);
                  std::__cxx11::string::~string((string *)&local_160);
                }
                bVar1 = Json::Value::isMember(pVVar5,"Status");
                if (bVar1) {
                  pVVar5 = Json::Value::operator[](pVVar5,"Status");
                  local_3d0 = Json::Value::asInt(pVVar5);
                }
                std::
                vector<aliyun::YundunDeleteCNameWafWafInfoType,_std::allocator<aliyun::YundunDeleteCNameWafWafInfoType>_>
                ::push_back(local_3c8,(value_type *)local_418);
                YundunDeleteCNameWafWafInfoType::~YundunDeleteCNameWafWafInfoType
                          ((YundunDeleteCNameWafWafInfoType *)local_418);
              }
            }
          }
        }
      }
      goto LAB_00135980;
    }
  }
  iVar2 = -1;
  if (error_info != (YundunErrorInfo *)0x0) {
    std::__cxx11::string::assign((char *)&error_info->code);
  }
LAB_00135980:
  AliRpcRequest::~AliRpcRequest(this_00);
  operator_delete(this_00,0x2c8);
  Json::Reader::~Reader(&reader);
  Json::Value::~Value(&val);
  std::__cxx11::string::~string((string *)&secheme);
  std::__cxx11::string::~string((string *)&str_response);
  return iVar2;
}

Assistant:

int Yundun::DeleteCNameWaf(const YundunDeleteCNameWafRequestType& req,
                      YundunDeleteCNameWafResponseType* response,
                       YundunErrorInfo* error_info) {
  std::string str_response;
  int status_code;
  int ret = 0;
  bool parse_success = false;
  std::string secheme = this->use_tls_ ? "https" : "http";
  AliRpcRequest* req_rpc = new AliRpcRequest(version_,
                         appid_,
                         secret_,
                         secheme + "://" + host_);
  if((!this->use_tls_) && this->proxy_host_ && this->proxy_host_[0]) {
    req_rpc->SetHttpProxy( this->proxy_host_);
  }
  Json::Value val;
  Json::Reader reader;
  req_rpc->AddRequestQuery("Action","DeleteCNameWaf");
  if(!req.instance_id.empty()) {
    req_rpc->AddRequestQuery("InstanceId", req.instance_id);
  }
  if(!req.domain.empty()) {
    req_rpc->AddRequestQuery("Domain", req.domain);
  }
  if(!req.cname_id.empty()) {
    req_rpc->AddRequestQuery("CnameId", req.cname_id);
  }
  if(!req.instance_type.empty()) {
    req_rpc->AddRequestQuery("InstanceType", req.instance_type);
  }
  if(this->region_id_ && this->region_id_[0]) {
    req_rpc->AddRequestQuery("RegionId", this->region_id_);
  }
  if(req_rpc->CommitRequest() != 0) {
     if(error_info) {
       error_info->code = "connect to host failed";
     }
     ret = -1;
     goto out;
  }
  status_code = req_rpc->WaitResponseHeaderComplete();
  req_rpc->ReadResponseBody(str_response);
  if(status_code > 0 && !str_response.empty()){
    parse_success = reader.parse(str_response, val);
  }
  if(!parse_success) {
    if(error_info) {
      error_info->code = "parse response failed";
    }
    ret = -1;
    goto out;
  }
  if(status_code!= 200 && error_info && parse_success) {
    error_info->request_id = val.isMember("RequestId") ? val["RequestId"].asString(): "";
    error_info->code = val.isMember("Code") ? val["Code"].asString(): "";
    error_info->host_id = val.isMember("HostId") ? val["HostId"].asString(): "";
    error_info->message = val.isMember("Message") ? val["Message"].asString(): "";
  }
  if(status_code== 200 && response) {
    Json2Type(val, response);
  }
  ret = status_code;
out:
  delete req_rpc;
  return ret;
}